

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

ChannelList *
Imf_3_4::channelsInView
          (ChannelList *__return_storage_ptr__,string *viewName,ChannelList *channelList,
          StringVector *multiView)

{
  _Rb_tree_header *p_Var1;
  __type _Var2;
  const_iterator cVar3;
  ConstIterator CVar4;
  string view;
  allocator<char> local_81;
  ChannelList *local_80;
  StringVector *local_78;
  string local_70;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = __return_storage_ptr__;
  local_78 = multiView;
  cVar3._M_node = (_Base_ptr)ChannelList::begin(channelList);
  while( true ) {
    CVar4 = ChannelList::end(channelList);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)(cVar3._M_node + 1),&local_81);
    viewFromChannelName(&local_50,&local_70,local_78);
    std::__cxx11::string::~string((string *)&local_70);
    _Var2 = std::operator==(&local_50,viewName);
    if (_Var2) {
      ChannelList::insert(local_80,(char *)(cVar3._M_node + 1),(Channel *)(cVar3._M_node + 9));
    }
    std::__cxx11::string::~string((string *)&local_50);
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  return local_80;
}

Assistant:

ChannelList
channelsInView (
    const string&       viewName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Return a list of all channels belonging to view viewName.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        //
        // Get view name for this channel
        //

        string view = viewFromChannelName (i.name (), multiView);

        //
        // Insert channel into q if it's a member of view viewName
        //

        if (view == viewName) q.insert (i.name (), i.channel ());
    }

    return q;
}